

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void DivisionHelper<unsigned_long,_unsigned_int,_0>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *t,uint *u,unsigned_long *result)

{
  ulong *in_RDX;
  uint *in_RSI;
  ulong *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*in_RDI == 0) {
    *in_RDX = 0;
  }
  else {
    *in_RDX = *in_RDI / (ulong)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        result = (T)( t/u );
    }